

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

string * __thiscall
fmt::v7::detail::vformat_abi_cxx11_
          (string *__return_storage_ptr__,detail *this,string_view format_str,format_args args)

{
  undefined1 *this_00;
  undefined1 value [16];
  undefined1 value_00 [16];
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  args_00;
  basic_string_view<char> format_str_00;
  custom_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> custom;
  bool bVar1;
  size_t sVar2;
  char *lhs;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *buf;
  undefined8 in_stack_fffffffffffffaa8;
  undefined8 in_stack_fffffffffffffab0;
  allocator<char> *alloc;
  allocator<char> local_4d9;
  undefined1 local_4d8 [8];
  memory_buffer buffer;
  undefined1 auStack_2b8 [8];
  format_arg arg;
  undefined1 auStack_290 [8];
  format_args args_local;
  string_view format_str_local;
  custom_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_258;
  basic_string_view<char> local_248 [3];
  undefined1 *local_210;
  undefined1 *local_208;
  string *local_200;
  undefined1 *local_1f0;
  string *local_1e8;
  undefined1 *local_1d8;
  string *local_1d0;
  undefined1 *local_1c0;
  string *local_1b8;
  undefined1 *local_1a8;
  string *local_1a0;
  undefined1 *local_170;
  string *local_150;
  undefined1 *local_120;
  string *local_100;
  undefined1 local_f1;
  undefined1 *local_f0;
  string *local_e8;
  byte local_d9;
  undefined1 *local_d8;
  string *local_d0;
  float local_c4;
  undefined1 *local_c0;
  string *local_b8;
  double local_b0;
  undefined1 *local_a8;
  string *local_a0;
  longdouble local_98;
  undefined1 *local_80;
  string *local_78;
  char *local_70;
  undefined1 *local_68;
  string *local_60;
  undefined1 *local_58;
  basic_string_view<char> local_50;
  string *local_40;
  void *local_38;
  undefined1 *local_30;
  string *local_28;
  undefined1 *local_20;
  monostate local_11;
  string *local_10;
  
  args_local.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = args.
           super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
           .desc_;
  auStack_290 = (undefined1  [8])format_str.size_;
  args_local.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
              )this;
  sVar2 = basic_string_view<char>::size
                    ((basic_string_view<char> *)
                     &args_local.
                      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                      .field_1);
  if (sVar2 == 2) {
    lhs = basic_string_view<char>::data
                    ((basic_string_view<char> *)
                     &args_local.
                      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                      .field_1);
    bVar1 = equal2(lhs,"{}");
    if (bVar1) {
      basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      ::get((format_arg *)auStack_2b8,
            (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
             *)auStack_290,0);
      bVar1 = basic_format_arg::operator_cast_to_bool((basic_format_arg *)auStack_2b8);
      if (bVar1) {
        this_00 = &buffer.field_0x216;
        local_210 = auStack_2b8;
        local_208 = this_00;
        local_200 = __return_storage_ptr__;
        switch(arg.value_.field_0.int128_value._8_4_) {
        case 0:
          break;
        case 1:
          local_1f0 = this_00;
          local_1e8 = __return_storage_ptr__;
          to_string<int,_0>(__return_storage_ptr__,auStack_2b8._0_4_);
          return __return_storage_ptr__;
        case 2:
          local_1d8 = this_00;
          local_1d0 = __return_storage_ptr__;
          to_string<unsigned_int,_0>(__return_storage_ptr__,auStack_2b8._0_4_);
          return __return_storage_ptr__;
        case 3:
          local_1c0 = this_00;
          local_1b8 = __return_storage_ptr__;
          to_string<long_long,_0>
                    (__return_storage_ptr__,CONCAT44(auStack_2b8._4_4_,auStack_2b8._0_4_));
          return __return_storage_ptr__;
        case 4:
          local_1a8 = this_00;
          local_1a0 = __return_storage_ptr__;
          to_string<unsigned_long_long,_0>
                    (__return_storage_ptr__,CONCAT44(auStack_2b8._4_4_,auStack_2b8._0_4_));
          return __return_storage_ptr__;
        case 5:
          value._8_8_ = in_stack_fffffffffffffab0;
          value._0_8_ = in_stack_fffffffffffffaa8;
          local_170 = this_00;
          local_150 = __return_storage_ptr__;
          to_string<__int128,_0>
                    (__return_storage_ptr__,(v7 *)CONCAT44(auStack_2b8._4_4_,auStack_2b8._0_4_),
                     (__int128)value);
          return __return_storage_ptr__;
        case 6:
          value_00._8_8_ = in_stack_fffffffffffffab0;
          value_00._0_8_ = in_stack_fffffffffffffaa8;
          local_120 = this_00;
          local_100 = __return_storage_ptr__;
          to_string<unsigned___int128,_0>
                    (__return_storage_ptr__,(v7 *)CONCAT44(auStack_2b8._4_4_,auStack_2b8._0_4_),
                     (unsigned___int128)value_00);
          return __return_storage_ptr__;
        case 7:
          local_f1 = auStack_2b8[0] & 1;
          local_f0 = this_00;
          local_e8 = __return_storage_ptr__;
          to_string<bool,_0>(__return_storage_ptr__,(bool)local_f1);
          return __return_storage_ptr__;
        case 8:
          local_d9 = auStack_2b8[0];
          local_d8 = this_00;
          local_d0 = __return_storage_ptr__;
          to_string<char,_0>(__return_storage_ptr__,auStack_2b8[0]);
          return __return_storage_ptr__;
        case 9:
          local_c0 = this_00;
          local_b8 = __return_storage_ptr__;
          to_string<float,_0>(__return_storage_ptr__,&local_c4);
          return __return_storage_ptr__;
        case 10:
          local_a8 = this_00;
          local_a0 = __return_storage_ptr__;
          to_string<double,_0>(__return_storage_ptr__,&local_b0);
          return __return_storage_ptr__;
        case 0xb:
          local_80 = this_00;
          local_78 = __return_storage_ptr__;
          to_string<long_double,_0>(__return_storage_ptr__,&local_98);
          return __return_storage_ptr__;
        case 0xc:
          local_68 = this_00;
          local_60 = __return_storage_ptr__;
          to_string<const_char_*,_0>(__return_storage_ptr__,&local_70);
          return __return_storage_ptr__;
        case 0xd:
          basic_string_view<char>::basic_string_view
                    (local_248,(char *)CONCAT44(auStack_2b8._4_4_,auStack_2b8._0_4_),
                     CONCAT62(arg.value_.field_0.long_long_value._2_6_,
                              arg.value_.field_0.int_value._0_2_));
          local_50.data_ = local_248[0].data_;
          local_50.size_ = local_248[0].size_;
          local_58 = this_00;
          local_40 = __return_storage_ptr__;
          to_string<fmt::v7::basic_string_view<char>,_0>(__return_storage_ptr__,&local_50);
          return __return_storage_ptr__;
        case 0xe:
          local_30 = this_00;
          local_28 = __return_storage_ptr__;
          to_string<const_void_*,_0>(__return_storage_ptr__,&local_38);
          return __return_storage_ptr__;
        case 0xf:
          custom.value._4_4_ = auStack_2b8._4_4_;
          custom.value._0_4_ = auStack_2b8._0_4_;
          custom.format._0_2_ = arg.value_.field_0.int_value._0_2_;
          custom.format._2_6_ = arg.value_.field_0.long_long_value._2_6_;
          basic_format_arg<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          ::handle::handle((handle *)&local_258,custom);
          stringifier::operator()[abi_cxx11_
                    (__return_storage_ptr__,(stringifier *)this_00,(handle)local_258);
          return __return_storage_ptr__;
        }
        local_20 = this_00;
        local_10 = __return_storage_ptr__;
        to_string<fmt::v7::monostate,_0>(__return_storage_ptr__,&local_11);
        return __return_storage_ptr__;
      }
      error_handler::on_error((error_handler *)&buffer.field_0x217,"argument not found");
    }
  }
  alloc = &local_4d9;
  std::allocator<char>::allocator();
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
            ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_4d8,alloc);
  std::allocator<char>::~allocator(&local_4d9);
  format_str_00.size_ = (size_t)format_str.data_;
  format_str_00.data_ =
       (char *)args_local.
               super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
               .field_1.values_;
  args_00.field_1 =
       (anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
        )args_local.
         super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
         .desc_;
  args_00.desc_ = (unsigned_long_long)auStack_290;
  vformat_to<char>((buffer<char> *)local_4d8,format_str_00,args_00);
  to_string<char,500ul>(__return_storage_ptr__,(v7 *)local_4d8,buf);
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
            ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_4d8);
  return __return_storage_ptr__;
}

Assistant:

FMT_FUNC std::string detail::vformat(string_view format_str, format_args args) {
  if (format_str.size() == 2 && equal2(format_str.data(), "{}")) {
    auto arg = args.get(0);
    if (!arg) error_handler().on_error("argument not found");
    return visit_format_arg(stringifier(), arg);
  }
  memory_buffer buffer;
  detail::vformat_to(buffer, format_str, args);
  return to_string(buffer);
}